

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tokenizer.cpp
# Opt level: O1

Token * __thiscall Tokenizer::peekToken(Tokenizer *this,int ahead)

{
  bool bVar1;
  bool bVar2;
  Token *in_RAX;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  int iVar3;
  _List_node_base *p_Var4;
  iterator it;
  iterator local_38;
  
  p_Var4 = (this->position).it._M_node;
  bVar2 = 0 < ahead;
  local_38._M_node = p_Var4;
  if (0 < ahead) {
    bVar1 = processElement(this,&local_38);
    in_RAX = (Token *)CONCAT71(extraout_var,bVar1);
    if (bVar1) {
      iVar3 = 0;
      do {
        p_Var4 = p_Var4->_M_next;
        local_38._M_node = p_Var4;
        if (ahead + -1 == iVar3) {
          bVar2 = false;
          goto LAB_0014b798;
        }
        bVar2 = processElement(this,&local_38);
        in_RAX = (Token *)CONCAT71(extraout_var_00,bVar2);
        iVar3 = iVar3 + 1;
      } while (bVar2);
      bVar2 = iVar3 < ahead;
    }
    in_RAX = &this->invalidToken;
  }
LAB_0014b798:
  if (!bVar2) {
    bVar2 = processElement(this,&local_38);
    if (bVar2) {
      in_RAX = (Token *)(local_38._M_node + 1);
    }
    else {
      in_RAX = &this->invalidToken;
    }
  }
  return in_RAX;
}

Assistant:

const Token& Tokenizer::peekToken(int ahead)
{
	auto it = position.it;
	for (int i = 0; i < ahead; i++)
	{
		if (!processElement(it))
			return invalidToken;

		++it;
	}
	
	if (!processElement(it))
		return invalidToken;

	return *it;
}